

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution::forward_int8(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined8 uVar16;
  undefined4 uVar23;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined1 uVar30;
  undefined8 uVar31;
  Mat *pMVar38;
  int iVar39;
  pointer piVar40;
  undefined1 uVar41;
  int iVar42;
  int iVar43;
  ulong uVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  int k;
  ulong uVar48;
  float *pfVar49;
  ulong __n;
  int iVar50;
  bool bVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  Option opt_g;
  vector<int,_std::allocator<int>_> _space_ofs;
  long local_140;
  allocator_type local_131;
  ulong local_130;
  int local_128;
  int local_124;
  Mat *local_120;
  ulong local_118;
  ulong local_110;
  Mat local_108;
  Mat local_b8;
  long local_70;
  long local_68;
  vector<int,_std::allocator<int>_> local_60;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uVar10;
  undefined3 uVar12;
  undefined2 uVar14;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined3 uVar19;
  undefined1 uVar20;
  undefined2 uVar21;
  undefined1 uVar22;
  undefined4 uVar25;
  undefined3 uVar27;
  undefined2 uVar29;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined3 uVar34;
  undefined1 uVar35;
  undefined2 uVar36;
  undefined1 uVar37;
  
  uVar3 = bottom_blob->c;
  iVar50 = this->kernel_w;
  iVar46 = this->dilation_w;
  iVar4 = this->kernel_h;
  iVar42 = this->dilation_h;
  sVar5 = bottom_blob->elemsize;
  local_b8.data = bottom_blob->data;
  piVar6 = bottom_blob->refcount;
  local_b8.refcount._0_4_ = SUB84(piVar6,0);
  local_b8.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
  local_b8.elemsize._0_4_ = (undefined4)sVar5;
  local_b8.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
  local_b8.elempack = bottom_blob->elempack;
  local_b8.allocator = bottom_blob->allocator;
  local_b8.dims = bottom_blob->dims;
  local_b8.w = bottom_blob->w;
  local_b8.h = bottom_blob->h;
  local_b8.d = bottom_blob->d;
  local_b8.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  local_120 = top_blob;
  local_b8.c = uVar3;
  if (sVar5 != 1) {
    local_108.data = *(void **)opt;
    uVar8 = opt->openmp_blocktime;
    uVar9 = opt->use_winograd_convolution;
    uVar11 = opt->use_sgemm_convolution;
    uVar13 = opt->use_int8_inference;
    uVar15 = opt->use_vulkan_compute;
    uVar14 = CONCAT11(uVar15,uVar13);
    uVar12 = CONCAT21(uVar14,uVar11);
    uVar10 = CONCAT31(uVar12,uVar9);
    local_108.allocator = *(Allocator **)&opt->use_bf16_storage;
    uVar16._0_1_ = opt->use_shader_pack8;
    uVar16._1_1_ = opt->use_subgroup_basic;
    uVar16._2_1_ = opt->use_subgroup_vote;
    uVar16._3_1_ = opt->use_subgroup_ballot;
    uVar17 = opt->use_subgroup_shuffle;
    uVar18 = opt->use_image_storage;
    uVar20 = opt->use_tensor_storage;
    uVar22 = opt->use_reserved_0;
    uVar21 = CONCAT11(uVar22,uVar20);
    uVar19 = CONCAT21(uVar21,uVar18);
    uVar16._4_4_ = CONCAT31(uVar19,uVar17);
    uVar23 = opt->flush_denormals;
    uVar24 = opt->use_local_pool_allocator;
    uVar26 = opt->use_shader_local_memory;
    uVar28 = opt->use_cooperative_matrix;
    uVar30 = opt->use_winograd23_convolution;
    uVar29 = CONCAT11(uVar30,uVar28);
    uVar27 = CONCAT21(uVar29,uVar26);
    uVar25 = CONCAT31(uVar27,uVar24);
    uVar31._0_1_ = opt->use_winograd43_convolution;
    uVar31._1_1_ = opt->use_winograd63_convolution;
    uVar31._2_1_ = opt->use_reserved_6;
    uVar31._3_1_ = opt->use_reserved_7;
    uVar32 = opt->use_reserved_8;
    uVar33 = opt->use_reserved_9;
    uVar35 = opt->use_reserved_10;
    uVar37 = opt->use_reserved_11;
    uVar36 = CONCAT11(uVar37,uVar35);
    uVar34 = CONCAT21(uVar36,uVar33);
    uVar31._4_4_ = CONCAT31(uVar34,uVar32);
    local_108.c = (int)uVar31;
    local_108.dims = (int)uVar16;
    local_108.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_108.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_108.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_108.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_108.elempack = uVar8;
    local_108._28_4_ = uVar10;
    local_108.w = uVar16._4_4_;
    local_108.h = uVar23;
    local_108.d = uVar25;
    local_108._60_4_ = uVar31._4_4_;
    quantize_to_int8(bottom_blob,&local_b8,&this->bottom_blob_int8_scales,(Option *)&local_108);
  }
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize._0_4_ = 0;
  local_108.elemsize._4_4_ = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  make_padding(this,&local_b8,&local_108,this->kernel_w,this->kernel_h,opt);
  iVar39 = local_108.w;
  iVar43 = -100;
  if ((local_108.data != (void *)0x0) && ((long)local_108.c * local_108.cstep != 0)) {
    uVar44 = (long)(~((iVar50 + -1) * iVar46) + local_108.w) / (long)this->stride_w;
    uVar48 = (long)(~((iVar4 + -1) * iVar42) + local_108.h) / (long)this->stride_h;
    __n = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector(&local_60,__n,&local_131);
    piVar40 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    pMVar38 = local_120;
    if (0 < this->kernel_h) {
      iVar50 = this->dilation_h;
      iVar46 = this->dilation_w;
      iVar4 = this->kernel_w;
      iVar42 = 0;
      iVar43 = 0;
      iVar45 = 0;
      do {
        if (0 < this->kernel_w) {
          lVar47 = 0;
          do {
            local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar42 + lVar47] = iVar45;
            iVar45 = iVar45 + this->dilation_w;
            lVar47 = lVar47 + 1;
          } while ((int)lVar47 < this->kernel_w);
          iVar42 = iVar42 + (int)lVar47;
        }
        iVar45 = iVar45 + (iVar39 * iVar50 - iVar46 * iVar4);
        iVar43 = iVar43 + 1;
      } while (iVar43 < this->kernel_h);
    }
    local_124 = this->int8_scale_term;
    local_118 = uVar48 & 0xffffffff;
    local_110 = uVar44 & 0xffffffff;
    Mat::create(local_120,(int)uVar44 + 1,(int)uVar48 + 1,this->num_output,
                (ulong)(local_124 < 0x65) * 3 + 1,opt->blob_allocator);
    iVar43 = -100;
    if ((pMVar38->data != (void *)0x0) && ((long)pMVar38->c * pMVar38->cstep != 0)) {
      if (0 < this->num_output) {
        local_128 = uVar3 * (int)__n;
        local_140 = 0;
        uVar44 = local_118;
        do {
          if (-1 < (int)uVar44) {
            pfVar49 = (float *)(local_120->cstep * local_140 * local_120->elemsize +
                               (long)local_120->data);
            local_70 = (long)(local_128 * (int)local_140);
            local_130 = 0;
            do {
              if (-1 < (int)local_110) {
                local_68 = (long)(int)local_130;
                iVar50 = 0;
                do {
                  fVar54 = 0.0;
                  fVar52 = 0.0;
                  if (0 < (int)uVar3) {
                    lVar47 = (long)(this->weight_data).data + local_70;
                    uVar44 = 0;
                    iVar46 = 0;
                    do {
                      if (0 < (int)__n) {
                        uVar48 = 0;
                        do {
                          iVar46 = iVar46 + (int)*(char *)(lVar47 + uVar48) *
                                            (int)*(char *)((long)local_108.data +
                                                          (long)piVar40[uVar48] +
                                                          local_108.cstep *
                                                          CONCAT44(local_108.elemsize._4_4_,
                                                                   (undefined4)local_108.elemsize) *
                                                          uVar44 + (long)iVar50 *
                                                                   (long)this->stride_w +
                                                                   (long)local_108.w *
                                                                   CONCAT44(local_108.elemsize._4_4_
                                                                            ,(undefined4)
                                                                             local_108.elemsize) *
                                                                   this->stride_h * local_68);
                          uVar48 = uVar48 + 1;
                        } while ((__n & 0xffffffff) != uVar48);
                      }
                      lVar47 = lVar47 + __n;
                      uVar44 = uVar44 + 1;
                    } while (uVar44 != uVar3);
                    fVar52 = (float)iVar46;
                  }
                  fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + local_140 * 4);
                  if (fVar1 != 0.0) {
                    fVar54 = 1.0 / (fVar1 * *(this->bottom_blob_int8_scales).data);
                  }
                  fVar54 = fVar54 * fVar52;
                  if (this->bias_term != 0) {
                    fVar54 = fVar54 + *(float *)((long)(this->bias_data).data + local_140 * 4);
                  }
                  fVar52 = fVar54;
                  switch(this->activation_type) {
                  case 1:
                    if (fVar54 <= 0.0) {
                      fVar52 = 0.0;
                    }
                    break;
                  case 2:
                    fVar52 = (float)(~-(uint)(0.0 < fVar54) & *(this->activation_params).data |
                                    -(uint)(0.0 < fVar54) & 0x3f800000) * fVar54;
                    break;
                  case 3:
                    pfVar7 = (float *)(this->activation_params).data;
                    fVar52 = *pfVar7;
                    if (fVar54 <= fVar52) {
                      fVar54 = fVar52;
                    }
                    fVar52 = pfVar7[1];
                    if (fVar54 <= fVar52) {
                      fVar52 = fVar54;
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar54) {
                      fVar54 = 88.37626;
                    }
                    fVar52 = expf((float)(-(uint)(fVar54 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar54 < -88.37626) & (uint)-fVar54));
                    fVar52 = 1.0 / (fVar52 + 1.0);
                    break;
                  case 5:
                    uStack_44 = 0;
                    uStack_40 = 0;
                    uStack_3c = 0;
                    local_48 = fVar54;
                    fVar52 = expf(fVar54);
                    fVar52 = logf(fVar52 + 1.0);
                    fVar52 = tanhf(fVar52);
                    fVar52 = fVar52 * local_48;
                    break;
                  case 6:
                    pfVar7 = (float *)(this->activation_params).data;
                    fVar1 = *pfVar7;
                    fVar2 = pfVar7[1];
                    fVar53 = -fVar2 / fVar1;
                    fVar52 = 0.0;
                    if ((fVar53 <= fVar54) && (fVar52 = fVar54, fVar54 <= fVar53 + 1.0 / fVar1)) {
                      fVar52 = (fVar1 * fVar54 + fVar2) * fVar54;
                    }
                  }
                  if (local_124 < 0x65) {
                    *pfVar49 = fVar52;
                    lVar47 = 4;
                  }
                  else {
                    fVar52 = roundf(fVar52 * *(this->top_blob_int8_scales).data);
                    iVar46 = (int)fVar52;
                    if (iVar46 < -0x7e) {
                      iVar46 = -0x7f;
                    }
                    uVar41 = (undefined1)iVar46;
                    if (0x7e < iVar46) {
                      uVar41 = 0x7f;
                    }
                    *(undefined1 *)pfVar49 = uVar41;
                    lVar47 = 1;
                  }
                  pfVar49 = (float *)((long)pfVar49 + lVar47);
                  bVar51 = iVar50 != (int)local_110;
                  iVar50 = iVar50 + 1;
                } while (bVar51);
              }
              iVar50 = (int)local_130;
              local_130 = (ulong)(iVar50 + 1);
              uVar44 = local_118;
            } while (iVar50 != (int)local_118);
          }
          local_140 = local_140 + 1;
        } while (local_140 < this->num_output);
      }
      iVar43 = 0;
    }
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize._0_4_ = 0;
  local_108.elemsize._4_4_ = 0;
  local_108.elempack = 0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  piVar6 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar43;
}

Assistant:

int Convolution::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Convolution input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scales, opt_g);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        signed char* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        int val = sptr[space_ofs[k]];
                        int wt = kptr[k];
                        sum += val * wt;
                    }

                    kptr += maxk;
                }

                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                if (use_int8_requantize)
                {
                    // requantize
                    float scale_out = top_blob_int8_scales[0];
                    signed char sums8 = float2int8(sumfp32 * scale_out);
                    outptr[0] = sums8;
                    outptr += 1;
                }
                else
                {
                    // dequantize
                    ((float*)outptr)[0] = sumfp32;
                    outptr += 4;
                }
            }
        }
    }

    return 0;
}